

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateElemDecl(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaElementPtr actxt;
  int iVar1;
  xmlSchemaTypePtr type;
  xmlSchemaTypePtr local_40;
  xmlSchemaTypePtr localType;
  xmlSchemaAttrInfoPtr iattr;
  xmlSchemaTypePtr pxStack_28;
  int ret;
  xmlSchemaTypePtr actualType;
  xmlSchemaElementPtr elemDecl;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  actualType = (xmlSchemaTypePtr)vctxt->inode->decl;
  elemDecl = (xmlSchemaElementPtr)vctxt;
  if (actualType == (xmlSchemaTypePtr)0x0) {
    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                       (xmlSchemaBasicItemPtr)0x0,"No matching declaration available",(xmlChar *)0x0
                       ,(xmlChar *)0x0);
    vctxt_local._4_4_ = *(int *)&elemDecl->namedType;
  }
  else {
    pxStack_28 = actualType->subtypes;
    if ((actualType->flags & 0x10U) == 0) {
      if (pxStack_28 == (xmlSchemaTypePtr)0x0) {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_1,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The type definition is absent",(xmlChar *)0x0
                           ,(xmlChar *)0x0);
        vctxt_local._4_4_ = 0x753;
      }
      else {
        if (vctxt->nbAttrInfos != 0) {
          localType = (xmlSchemaTypePtr)xmlSchemaGetMetaAttrInfo(vctxt,2);
          actxt = elemDecl;
          if (localType != (xmlSchemaTypePtr)0x0) {
            elemDecl->idcs = localType;
            type = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
            iattr._4_4_ = xmlSchemaVCheckCVCSimpleType
                                    ((xmlSchemaAbstractCtxtPtr)actxt,(xmlNodePtr)0x0,type,
                                     localType->refNs,(xmlSchemaValPtr *)&localType->annot,1,0,0);
            elemDecl->idcs =
                 *(void **)(elemDecl->refPrefix + (long)*(int *)&elemDecl->field_0xac * 8);
            if (iattr._4_4_ < 0) {
              xmlSchemaInternalErr
                        ((xmlSchemaAbstractCtxtPtr)elemDecl,"xmlSchemaValidateElemDecl",
                         "calling xmlSchemaVCheckCVCSimpleType() to validate the attribute \'xsi:nil\'"
                        );
              return -1;
            }
            if (iattr._4_4_ == 0) {
              if ((actualType->flags & 1U) == 0) {
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)elemDecl,XML_SCHEMAV_CVC_ELT_3_1,
                                   (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                   "The element is not \'nillable\'",(xmlChar *)0x0,(xmlChar *)0x0);
              }
              else {
                iVar1 = xmlSchemaValueGetAsBoolean((xmlSchemaValPtr)localType->annot);
                if (iVar1 != 0) {
                  if (((actualType->flags & 8U) == 0) ||
                     (actualType->attributeUses == (xmlSchemaAttributeLinkPtr *)0x0)) {
                    *(uint *)((long)elemDecl->idcs + 0x40) =
                         *(uint *)((long)elemDecl->idcs + 0x40) | 4;
                  }
                  else {
                    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)elemDecl,XML_SCHEMAV_CVC_ELT_3_2_2,
                                       (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                       "The element cannot be \'nilled\' because there is a fixed value constraint defined for it"
                                       ,(xmlChar *)0x0,(xmlChar *)0x0);
                  }
                }
              }
            }
          }
          localType = (xmlSchemaTypePtr)xmlSchemaGetMetaAttrInfo((xmlSchemaValidCtxtPtr)elemDecl,1);
          if (localType != (xmlSchemaTypePtr)0x0) {
            local_40 = (xmlSchemaTypePtr)0x0;
            iattr._4_4_ = xmlSchemaProcessXSIType
                                    ((xmlSchemaValidCtxtPtr)elemDecl,(xmlSchemaAttrInfoPtr)localType
                                     ,&local_40,(xmlSchemaElementPtr)actualType);
            if ((iattr._4_4_ != 0) && (iattr._4_4_ == -1)) {
              xmlSchemaInternalErr
                        ((xmlSchemaAbstractCtxtPtr)elemDecl,"xmlSchemaValidateElemDecl",
                         "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:type\'");
              return -1;
            }
            if (local_40 != (xmlSchemaTypePtr)0x0) {
              *(uint *)((long)elemDecl->idcs + 0x40) = *(uint *)((long)elemDecl->idcs + 0x40) | 8;
              pxStack_28 = local_40;
            }
          }
        }
        if ((actualType->contentTypeDef == (xmlSchemaTypePtr)0x0) ||
           (iVar1 = xmlSchemaIDCRegisterMatchers
                              ((xmlSchemaValidCtxtPtr)elemDecl,(xmlSchemaElementPtr)actualType),
           iVar1 != -1)) {
          if (pxStack_28 == (xmlSchemaTypePtr)0x0) {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)elemDecl,XML_SCHEMAV_CVC_TYPE_1,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                               "The type definition is absent",(xmlChar *)0x0,(xmlChar *)0x0);
            vctxt_local._4_4_ = 0x753;
          }
          else {
            *(xmlSchemaTypePtr *)((long)elemDecl->idcs + 0x38) = pxStack_28;
            vctxt_local._4_4_ = 0;
          }
        }
        else {
          vctxt_local._4_4_ = -1;
        }
      }
    }
    else {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_2,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)0x0,"The element declaration is abstract",
                         (xmlChar *)0x0,(xmlChar *)0x0);
      vctxt_local._4_4_ = *(int *)&elemDecl->namedType;
    }
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidateElemDecl(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaElementPtr elemDecl = vctxt->inode->decl;
    xmlSchemaTypePtr actualType;

    /*
    * cvc-elt (3.3.4) : 1
    */
    if (elemDecl == NULL) {
	VERROR(XML_SCHEMAV_CVC_ELT_1, NULL,
	    "No matching declaration available");
        return (vctxt->err);
    }
    actualType = WXS_ELEM_TYPEDEF(elemDecl);
    /*
    * cvc-elt (3.3.4) : 2
    */
    if (elemDecl->flags & XML_SCHEMAS_ELEM_ABSTRACT) {
	VERROR(XML_SCHEMAV_CVC_ELT_2, NULL,
	    "The element declaration is abstract");
        return (vctxt->err);
    }
    if (actualType == NULL) {
	VERROR(XML_SCHEMAV_CVC_TYPE_1, NULL,
	    "The type definition is absent");
	return (XML_SCHEMAV_CVC_TYPE_1);
    }
    if (vctxt->nbAttrInfos != 0) {
	int ret;
	xmlSchemaAttrInfoPtr iattr;
	/*
	* cvc-elt (3.3.4) : 3
	* Handle 'xsi:nil'.
	*/
	iattr = xmlSchemaGetMetaAttrInfo(vctxt,
	    XML_SCHEMA_ATTR_INFO_META_XSI_NIL);
	if (iattr) {
	    ACTIVATE_ATTRIBUTE(iattr);
	    /*
	    * Validate the value.
	    */
	    ret = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt, NULL,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN),
		iattr->value, &(iattr->val), 1, 0, 0);
	    ACTIVATE_ELEM;
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElemDecl",
		    "calling xmlSchemaVCheckCVCSimpleType() to "
		    "validate the attribute 'xsi:nil'");
		return (-1);
	    }
	    if (ret == 0) {
		if ((elemDecl->flags & XML_SCHEMAS_ELEM_NILLABLE) == 0) {
		    /*
		    * cvc-elt (3.3.4) : 3.1
		    */
		    VERROR(XML_SCHEMAV_CVC_ELT_3_1, NULL,
			"The element is not 'nillable'");
		    /* Does not return an error on purpose. */
		} else {
		    if (xmlSchemaValueGetAsBoolean(iattr->val)) {
			/*
			* cvc-elt (3.3.4) : 3.2.2
			*/
			if ((elemDecl->flags & XML_SCHEMAS_ELEM_FIXED) &&
			    (elemDecl->value != NULL)) {
			    VERROR(XML_SCHEMAV_CVC_ELT_3_2_2, NULL,
				"The element cannot be 'nilled' because "
				"there is a fixed value constraint defined "
				"for it");
			     /* Does not return an error on purpose. */
			} else
			    vctxt->inode->flags |=
				XML_SCHEMA_ELEM_INFO_NILLED;
		    }
		}
	    }
	}
	/*
	* cvc-elt (3.3.4) : 4
	* Handle 'xsi:type'.
	*/
	iattr = xmlSchemaGetMetaAttrInfo(vctxt,
	    XML_SCHEMA_ATTR_INFO_META_XSI_TYPE);
	if (iattr) {
	    xmlSchemaTypePtr localType = NULL;

	    ret = xmlSchemaProcessXSIType(vctxt, iattr, &localType,
		elemDecl);
	    if (ret != 0) {
		if (ret == -1) {
		    VERROR_INT("xmlSchemaValidateElemDecl",
			"calling xmlSchemaProcessXSIType() to "
			"process the attribute 'xsi:type'");
		    return (-1);
		}
		/* Does not return an error on purpose. */
	    }
	    if (localType != NULL) {
		vctxt->inode->flags |= XML_SCHEMA_ELEM_INFO_LOCAL_TYPE;
		actualType = localType;
	    }
	}
    }
    /*
    * IDC: Register identity-constraint XPath matchers.
    */
    if ((elemDecl->idcs != NULL) &&
	(xmlSchemaIDCRegisterMatchers(vctxt, elemDecl) == -1))
	    return (-1);
    /*
    * No actual type definition.
    */
    if (actualType == NULL) {
	VERROR(XML_SCHEMAV_CVC_TYPE_1, NULL,
	    "The type definition is absent");
	return (XML_SCHEMAV_CVC_TYPE_1);
    }
    /*
    * Remember the actual type definition.
    */
    vctxt->inode->typeDef = actualType;

    return (0);
}